

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O3

EStatusCode __thiscall Type1Input::Type1Seac(Type1Input *this,LongList *inOperandList)

{
  EStatusCode EVar1;
  _List_const_iterator<long> __tmp;
  Trace *this_00;
  uchar local_12;
  uchar local_11;
  
  if ((inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size < 2) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1Input::Type1Seac exception, there should be 2 parameters provided for seac operation but only %d provided"
                      ,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                       _M_node._M_size);
    EVar1 = eFailure;
  }
  else {
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::_M_insert_unique<unsigned_char>
              ((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *)this->mCurrentDependencies,&local_11);
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::_M_insert_unique<unsigned_char>
              ((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *)this->mCurrentDependencies,&local_12);
    EVar1 = eSuccess;
  }
  return EVar1;
}

Assistant:

EStatusCode Type1Input::Type1Seac(const LongList& inOperandList)
{
	if(inOperandList.size() < 2) {
		TRACE_LOG1("Type1Input::Type1Seac exception, there should be 2 parameters provided for seac operation but only %d provided",inOperandList.size());
		return eFailure;		
	}

	LongList::const_reverse_iterator it = inOperandList.rbegin();

	mCurrentDependencies->mCharCodes.insert((Byte)*it);
	++it;
	mCurrentDependencies->mCharCodes.insert((Byte)*it);
	return eSuccess;
}